

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O2

void __thiscall
amrex::MLNodeLinOp::applyBC
          (MLNodeLinOp *this,int amrlev,int mglev,MultiFab *phi,BCMode param_4,StateMode state_mode,
          bool skip_fillboundary)

{
  int *piVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined8 uVar4;
  GpuArray<amrex::LinOpBCType,_3U> bclo;
  GpuArray<amrex::LinOpBCType,_3U> bchi;
  long lVar5;
  long lVar6;
  Box bx;
  MFIter mfi;
  Box local_8c;
  Array4<double> local_70;
  
  this->m_in_solution_mode = state_mode == Solution;
  lVar3 = *(long *)&(this->super_MLLinOp).m_geom.
                    super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[amrlev].
                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar6 = (long)mglev * 200;
  piVar1 = (int *)(lVar3 + 0xac + lVar6);
  bx.smallend.vect._0_8_ = *(undefined8 *)piVar1;
  uVar4 = *(undefined8 *)(piVar1 + 2);
  puVar2 = (undefined8 *)(lVar3 + 0xb8 + lVar6);
  bx.bigend.vect[1] = (int)((ulong)*puVar2 >> 0x20);
  bx._20_8_ = puVar2[1];
  bx.smallend.vect[2] = (int)uVar4;
  bx.bigend.vect[0] = (int)((ulong)uVar4 >> 0x20);
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    if ((bx.btype.itype >> ((uint)lVar5 & 0x1f) & 1) == 0) {
      piVar1 = bx.bigend.vect + lVar5;
      *piVar1 = *piVar1 + 1;
    }
  }
  bx.btype.itype = 7;
  if (!skip_fillboundary) {
    mfi._0_12_ = Geometry::periodicity((Geometry *)(lVar3 + lVar6));
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (&phi->super_FabArray<amrex::FArrayBox>,(Periodicity *)&mfi,false);
  }
  if (this->m_coarsening_strategy == Sigma) {
    bclo.arr = *&((this->super_MLLinOp).m_lobc.
                  super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  .
                  super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems;
    bchi.arr = *&((this->super_MLLinOp).m_hibc.
                  super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  .
                  super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems;
    MFIter::MFIter(&mfi,(FabArrayBase *)phi,'\0');
    while (mfi.currentIndex < mfi.endIndex) {
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_70,&phi->super_FabArray<amrex::FArrayBox>,&mfi);
      MFIter::validbox(&local_8c,&mfi);
      mlndlap_applybc<double>(&local_8c,&local_70,&bx,bclo,bchi);
      MFIter::operator++(&mfi);
    }
    MFIter::~MFIter(&mfi);
  }
  return;
}

Assistant:

void
MLNodeLinOp::applyBC (int amrlev, int mglev, MultiFab& phi, BCMode/* bc_mode*/,
                      StateMode state_mode, bool skip_fillboundary) const
{
    BL_PROFILE("MLNodeLinOp::applyBC()");

    m_in_solution_mode = state_mode == StateMode::Solution;

    const Geometry& geom = m_geom[amrlev][mglev];
    const Box& nd_domain = amrex::surroundingNodes(geom.Domain());

    if (!skip_fillboundary) {
        phi.FillBoundary(geom.periodicity());
    }

    if (m_coarsening_strategy == CoarseningStrategy::Sigma)
    {
        const auto lobc = LoBC();
        const auto hibc = HiBC();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(phi); mfi.isValid(); ++mfi)
        {
            Array4<Real> const& fab = phi.array(mfi);
            mlndlap_applybc(mfi.validbox(),fab,nd_domain,lobc,hibc);
        }
    }
}